

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockPlanar57c
               (uint compressed57_1,uint compressed57_2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  uVar16 = compressed57_1 >> 0x12 & 0xfe;
  uVar11 = compressed57_1 >> 0xb & 0xfc;
  uVar13 = compressed57_1 >> 0x11 & 3;
  iVar19 = (compressed57_1 >> 9 & 0x3f0) + uVar13 * 4 + 2;
  uVar8 = compressed57_1 >> 0x19 & 1;
  iVar17 = (compressed57_1 >> 0x10 & 0x3f8) + uVar8 * 4 + 2;
  uVar2 = compressed57_1 >> 0x18 & 0xfffffffc;
  uVar9 = compressed57_1 >> 0x1e;
  iVar4 = (width * starty + startx) * channels;
  iVar14 = (compressed57_1 >> 0x16 & 0xfffffff0) + uVar9 * 4 + 2;
  iVar3 = 0;
  do {
    lVar10 = 4;
    iVar18 = iVar17;
    iVar5 = iVar4;
    iVar15 = iVar14;
    iVar12 = iVar19;
    do {
      iVar7 = iVar15 >> 2;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      iVar1 = iVar18 >> 2;
      if (0xfe < iVar18 >> 2) {
        iVar1 = 0xff;
      }
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      img[iVar5] = (uint8)iVar7;
      img[(long)iVar5 + 1] = (uint8)iVar1;
      iVar7 = iVar12 >> 2;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      uVar6 = (uint8)iVar7;
      if (iVar7 < 1) {
        uVar6 = '\0';
      }
      img[(long)iVar5 + 2] = uVar6;
      iVar5 = iVar5 + channels * width;
      iVar12 = iVar12 + (((compressed57_2 >> 0xb & 3 | compressed57_2 >> 5 & 0xfc) - uVar13) -
                        uVar11);
      iVar18 = iVar18 + (((compressed57_2 >> 0x13 & 1 | compressed57_2 >> 0xc & 0xfe) - uVar8) -
                        uVar16);
      iVar15 = iVar15 + (((compressed57_2 >> 0x18 & 3 | compressed57_2 >> 0x12 & 0xfc) - uVar9) -
                        uVar2);
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    iVar3 = iVar3 + 1;
    iVar4 = iVar4 + channels;
    iVar19 = iVar19 + (((compressed57_2 >> 0x1e | compressed57_2 >> 0x18 & 0xfffffffc) - uVar13) -
                      uVar11);
    iVar17 = iVar17 + (((((compressed57_1 & 0x7f) >> 6) + (compressed57_1 & 0x7f) * 2) - uVar8) -
                      uVar16);
    iVar14 = iVar14 + (((compressed57_1 >> 0xb & 3 | compressed57_1 >> 5 & 0xfc) - uVar9) - uVar2);
  } while (iVar3 != 4);
  return;
}

Assistant:

void decompressBlockPlanar57c(unsigned int compressed57_1, unsigned int compressed57_2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 colorO[3], colorH[3], colorV[3];

	colorO[0] = GETBITSHIGH( compressed57_1, 6, 63);
	colorO[1] = GETBITSHIGH( compressed57_1, 7, 57);
	colorO[2] = GETBITSHIGH( compressed57_1, 6, 50);
	colorH[0] = GETBITSHIGH( compressed57_1, 6, 44);
	colorH[1] = GETBITSHIGH( compressed57_1, 7, 38);
	colorH[2] = GETBITS(     compressed57_2, 6, 31);
	colorV[0] = GETBITS(     compressed57_2, 6, 25);
	colorV[1] = GETBITS(     compressed57_2, 7, 19);
	colorV[2] = GETBITS(     compressed57_2, 6, 12);

	colorO[0] = (colorO[0] << 2) | (colorO[0] >> 4);
	colorO[1] = (colorO[1] << 1) | (colorO[1] >> 6);
	colorO[2] = (colorO[2] << 2) | (colorO[2] >> 4);

	colorH[0] = (colorH[0] << 2) | (colorH[0] >> 4);
	colorH[1] = (colorH[1] << 1) | (colorH[1] >> 6);
	colorH[2] = (colorH[2] << 2) | (colorH[2] >> 4);

	colorV[0] = (colorV[0] << 2) | (colorV[0] >> 4);
	colorV[1] = (colorV[1] << 1) | (colorV[1] >> 6);
	colorV[2] = (colorV[2] << 2) | (colorV[2] >> 4);

	int xx, yy;

	for( xx=0; xx<4; xx++)
	{
		for( yy=0; yy<4; yy++)
		{
			img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = CLAMP(0, ((xx*(colorH[0]-colorO[0]) + yy*(colorV[0]-colorO[0]) + 4*colorO[0] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = CLAMP(0, ((xx*(colorH[1]-colorO[1]) + yy*(colorV[1]-colorO[1]) + 4*colorO[1] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = CLAMP(0, ((xx*(colorH[2]-colorO[2]) + yy*(colorV[2]-colorO[2]) + 4*colorO[2] + 2) >> 2),255);

			//Equivalent method
			/*img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[0]-colorO[0])/4.0 + yy*(colorV[0]-colorO[0])/4.0 + colorO[0])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[1]-colorO[1])/4.0 + yy*(colorV[1]-colorO[1])/4.0 + colorO[1])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[2]-colorO[2])/4.0 + yy*(colorV[2]-colorO[2])/4.0 + colorO[2])), 255);*/
			
		}
	}
}